

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::Initialize
          (TPZGeoBlend<pzgeom::TPZGeoPoint> *this,TPZGeoEl *refel)

{
  this->fGeoEl = refel;
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Initialize(TPZGeoEl *refel)
{
    fGeoEl = refel;
    for(int byside = TGeo::NNodes; byside < (TGeo::NSides); byside++)
    {
        if (refel->SideIsUndefined(byside)) {
            continue;
        }
        TPZGeoElSide ElemSide(refel,byside);
        TPZGeoElSide NextSide(ElemSide.Neighbour());
        if(!NextSide.Element()) continue;
        while(NextSide.Element() != ElemSide.Element())
        {
            if(NextSide.Exists() && !NextSide.Element()->IsLinearMapping() && !NextSide.Element()->IsGeoBlendEl())
            {
                TPZGeoElSide NeighSide = NextSide;
                TPZTransform<> NeighTransf(NeighSide.Dimension(),NeighSide.Dimension());
                ElemSide.SideTransform3(NeighSide,NeighTransf);
                SetNeighbourInfo(byside,NeighSide,NeighTransf);
                break;
            }
            NextSide = NextSide.Neighbour();
        }
    }
}